

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_hello_message(mg_session *session,mg_message_hello **message)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  mg_map **in_RDI;
  mg_message_hello *tmessage;
  mg_map *extra;
  int status;
  mg_allocator *in_stack_ffffffffffffffc8;
  mg_allocator *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = mg_session_read_map((mg_session *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  if (iVar1 == 0) {
    puVar2 = (undefined8 *)
             mg_allocator_malloc(in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    if (puVar2 == (undefined8 *)0x0) {
      mg_map_destroy_ca((mg_map *)0x0,in_stack_ffffffffffffffc8);
      iVar1 = -3;
    }
    else {
      *puVar2 = local_28;
      *in_RSI = puVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_hello_message(mg_session *session,
                                  mg_message_hello **message) {
  int status = 0;

  mg_map *extra;
  status = mg_session_read_map(session, &extra);
  if (status != 0) {
    return status;
  }

  mg_message_hello *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message_hello));
  if (!tmessage) {
    status = MG_ERROR_OOM;
    goto cleanup;
  }

  tmessage->extra = extra;
  *message = tmessage;
  return 0;

cleanup:
  mg_map_destroy_ca(extra, session->decoder_allocator);
  return status;
}